

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cancellation_signal.hpp
# Opt level: O1

op_cancellation * __thiscall
asio::cancellation_slot::
emplace<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::op_cancellation,asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>*,asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::per_timer_data*>
          (cancellation_slot *this,
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          **args,per_timer_data **args_1)

{
  per_timer_data *ppVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  cancellation_handler_base *pcVar4;
  _func_int **extraout_RDX;
  undefined8 uVar5;
  _func_int **pp_Var6;
  
  if (*this->handler_ == (cancellation_handler_base *)0x0) {
    pp_Var6 = (_func_int **)0x0;
    pcVar4 = (cancellation_handler_base *)0x0;
  }
  else {
    iVar2 = (*(*this->handler_)->_vptr_cancellation_handler_base[1])();
    pcVar4 = (cancellation_handler_base *)CONCAT44(extraout_var,iVar2);
    *this->handler_ = (cancellation_handler_base *)0x0;
    pp_Var6 = extraout_RDX;
  }
  if (pp_Var6 < &DAT_00000020 || ((ulong)pcVar4 & 7) != 0) {
    if (pcVar4 != (cancellation_handler_base *)0x0) {
      plVar3 = (long *)__tls_get_addr(&PTR_0057ce40);
      if (*plVar3 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(undefined8 *)(*plVar3 + 8);
      }
      detail::thread_info_base::deallocate<asio::detail::thread_info_base::cancellation_signal_tag>
                (uVar5,pcVar4,pp_Var6);
    }
    plVar3 = (long *)__tls_get_addr(&PTR_0057ce40);
    if (*plVar3 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(undefined8 *)(*plVar3 + 8);
    }
    pp_Var6 = (_func_int **)&DAT_00000020;
    pcVar4 = (cancellation_handler_base *)
             detail::thread_info_base::
             allocate<asio::detail::thread_info_base::cancellation_signal_tag>(uVar5,0x20,8);
  }
  pcVar4->_vptr_cancellation_handler_base = (_func_int **)&PTR_call_00562da8;
  ppVar1 = *args_1;
  pcVar4[1]._vptr_cancellation_handler_base = (_func_int **)*args;
  pcVar4[2]._vptr_cancellation_handler_base = (_func_int **)ppVar1;
  pcVar4[3]._vptr_cancellation_handler_base = pp_Var6;
  *this->handler_ = pcVar4;
  return (op_cancellation *)(pcVar4 + 1);
}

Assistant:

CancellationHandler& emplace(Args&&... args)
  {
    typedef detail::cancellation_handler<CancellationHandler>
      cancellation_handler_type;
    auto_delete_helper del = { prepare_memory(
        sizeof(cancellation_handler_type),
        alignof(CancellationHandler)) };
    cancellation_handler_type* handler_obj =
      new (del.mem.first) cancellation_handler_type(
        del.mem.second, static_cast<Args&&>(args)...);
    del.mem.first = 0;
    *handler_ = handler_obj;
    return handler_obj->handler();
  }